

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_disk_secure746.c
# Opt level: O0

void test_write_disk_secure746a(void)

{
  int iVar1;
  archive *_a;
  archive_entry *entry;
  la_ssize_t v2;
  archive_entry *ae;
  archive *a;
  
  assertion_umask("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure746.c"
                  ,L'-',L'\x12');
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure746.c"
                     ,L'0',"target",L'ǀ');
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure746.c"
                      ,L'1',"target/foo",L'ǀ',L'\xffffffff',"unmodified");
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure746.c"
                     ,L'4',"sandbox",L'ǀ');
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure746.c"
                  ,L'5',"sandbox");
  _a = archive_write_disk_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure746.c"
                   ,L'8',(uint)(_a != (archive *)0x0),"(a = archive_write_disk_new()) != NULL",
                   (void *)0x0);
  archive_write_disk_set_options(_a,L'Ȁ');
  entry = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure746.c"
                   ,L'<',(uint)(entry != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL",
                   (void *)0x0);
  archive_entry_copy_pathname(entry,"bar");
  archive_entry_set_mode(entry,0x81ff);
  archive_entry_set_size(entry,8);
  archive_entry_copy_hardlink(entry,"../target/foo");
  iVar1 = archive_write_header(_a,entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure746.c"
                      ,L'A',-0x19,"ARCHIVE_FAILED",(long)iVar1,"archive_write_header(a, ae)",
                      (void *)0x0);
  v2 = archive_write_data(_a,"modified",8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure746.c"
                      ,L'B',-0x1e,"ARCHIVE_FATAL",v2,"archive_write_data(a, \"modified\", 8)",
                      (void *)0x0);
  archive_entry_free(entry);
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure746.c"
             ,L'F',"unmodified","../target/foo");
  iVar1 = archive_write_close(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_disk_secure746.c"
                      ,L'H',-0x1e,"ARCHIVE_FATAL",(long)iVar1,"archive_write_close(a)",_a);
  archive_write_free(_a);
  return;
}

Assistant:

DEFINE_TEST(test_write_disk_secure746a)
{
	struct archive *a;
	struct archive_entry *ae;

	/* Start with a known umask. */
	assertUmask(UMASK);

	/* The target directory we're going to try to affect. */
	assertMakeDir("target", 0700);
	assertMakeFile("target/foo", 0700, "unmodified");

	/* The sandbox dir we're going to work within. */
	assertMakeDir("sandbox", 0700);
	assertChdir("sandbox");

	/* Create an archive_write_disk object. */
	assert((a = archive_write_disk_new()) != NULL);
	archive_write_disk_set_options(a, ARCHIVE_EXTRACT_SECURE_NODOTDOT);

	/* Attempt to hardlink to the target directory. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "bar");
	archive_entry_set_mode(ae, AE_IFREG | 0777);
	archive_entry_set_size(ae, 8);
	archive_entry_copy_hardlink(ae, "../target/foo");
	assertEqualInt(ARCHIVE_FAILED, archive_write_header(a, ae));
	assertEqualInt(ARCHIVE_FATAL, archive_write_data(a, "modified", 8));
	archive_entry_free(ae);

	/* Verify that target file contents are unchanged. */
	assertTextFileContents("unmodified", "../target/foo");

	assertEqualIntA(a, ARCHIVE_FATAL, archive_write_close(a));
	archive_write_free(a);
}